

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::mark_down(Omega_h *this,Mesh *mesh,Int high_dim,Int low_dim,Read<signed_char> *high_marked)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Mesh *pMVar5;
  Alloc *this_00;
  Alloc *this_01;
  undefined8 uVar6;
  undefined4 in_register_00000014;
  void *pvVar7;
  void *extraout_RDX;
  char *pcVar8;
  bool bVar9;
  Read<signed_char> RVar10;
  Adj l2h;
  Alloc *local_c8;
  element_type *peStack_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8 [2];
  Alloc *local_a8;
  LO local_a0 [2];
  Mesh *local_98;
  Read<signed_char> local_90;
  Graph local_80;
  Adj local_60;
  
  if (low_dim < 0) {
    pcVar8 = "0 <= low_dim";
    uVar6 = 0x24;
  }
  else if (high_dim < low_dim) {
    pcVar8 = "low_dim <= high_dim";
    uVar6 = 0x25;
  }
  else {
    if ((uint)high_dim < 4) {
      if (high_dim == low_dim) {
        pAVar3 = (high_marked->write_).shared_alloc_.alloc;
        *(Alloc **)this = pAVar3;
        *(void **)(this + 8) = (high_marked->write_).shared_alloc_.direct_ptr;
        bVar9 = ((ulong)pAVar3 & 7) != 0;
        pvVar7 = (void *)CONCAT71((int7)(CONCAT44(in_register_00000014,high_dim) >> 8),
                                  bVar9 || pAVar3 == (Alloc *)0x0);
        if ((!bVar9 && pAVar3 != (Alloc *)0x0) && (entering_parallel == '\x01')) {
          pAVar3->use_count = pAVar3->use_count + -1;
          *(size_t *)this = pAVar3->size * 8 + 1;
        }
        (high_marked->write_).shared_alloc_.alloc = (Alloc *)0x0;
        (high_marked->write_).shared_alloc_.direct_ptr = (void *)0x0;
      }
      else {
        Mesh::ask_up(&local_60,mesh,low_dim,high_dim);
        local_80.a2ab.write_.shared_alloc_.alloc =
             local_60.super_Graph.a2ab.write_.shared_alloc_.alloc;
        if (((ulong)local_60.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
            local_60.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_80.a2ab.write_.shared_alloc_.alloc =
                 (Alloc *)((local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
                 (local_60.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        pAVar3 = local_80.a2ab.write_.shared_alloc_.alloc;
        local_80.a2ab.write_.shared_alloc_.direct_ptr =
             local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
        local_80.ab2b.write_.shared_alloc_.alloc =
             local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
        if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
            local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_80.ab2b.write_.shared_alloc_.alloc =
                 (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
                 (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        this_01 = local_80.ab2b.write_.shared_alloc_.alloc;
        local_80.ab2b.write_.shared_alloc_.direct_ptr =
             local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
        local_90.write_.shared_alloc_.alloc = (high_marked->write_).shared_alloc_.alloc;
        if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
            local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_90.write_.shared_alloc_.alloc =
                 (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
          }
          else {
            (local_90.write_.shared_alloc_.alloc)->use_count =
                 (local_90.write_.shared_alloc_.alloc)->use_count + 1;
          }
        }
        this_00 = local_90.write_.shared_alloc_.alloc;
        local_90.write_.shared_alloc_.direct_ptr = (high_marked->write_).shared_alloc_.direct_ptr;
        local_98 = mesh;
        mark_down(this,&local_80,&local_90);
        if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
          piVar1 = &this_00->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(this_00);
            operator_delete(this_00,0x48);
          }
        }
        if (((ulong)this_01 & 7) == 0 && this_01 != (Alloc *)0x0) {
          piVar1 = &this_01->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(this_01);
            operator_delete(this_01,0x48);
          }
        }
        if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
          piVar1 = &pAVar3->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar3);
            operator_delete(pAVar3,0x48);
          }
        }
        pMVar5 = local_98;
        bVar9 = Mesh::owners_have_all_upward(local_98,low_dim);
        local_b8[0]._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this;
        if (!bVar9) {
          local_a8 = (Alloc *)local_b8[0]._M_pi;
          if (((ulong)local_b8[0]._M_pi & 7) == 0 && (Alloc *)local_b8[0]._M_pi != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_a8 = (Alloc *)(((Alloc *)local_b8[0]._M_pi)->size * 8 + 1);
            }
            else {
              ((Alloc *)local_b8[0]._M_pi)->use_count = ((Alloc *)local_b8[0]._M_pi)->use_count + 1;
            }
          }
          local_a0 = *(LO (*) [2])(this + 8);
          Mesh::reduce_array<signed_char>
                    ((Mesh *)&local_c8,(Int)pMVar5,(Read<signed_char> *)(ulong)(uint)low_dim,
                     (Int)&local_a8,OMEGA_H_MAX);
          pAVar3 = *(Alloc **)this;
          if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
            piVar1 = &pAVar3->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar3);
              operator_delete(pAVar3,0x48);
            }
          }
          pAVar3 = local_a8;
          *(Alloc **)this = local_c8;
          *(element_type **)(this + 8) = peStack_c0;
          local_b8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8;
          if ((((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) &&
             (entering_parallel == '\x01')) {
            local_c8->use_count = local_c8->use_count + -1;
            local_b8[0]._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_c8->size * 8 + 1);
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this = local_b8[0]._M_pi;
          }
          local_c8 = (Alloc *)0x0;
          peStack_c0 = (element_type *)0x0;
          if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
            piVar1 = &local_a8->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_a8);
              operator_delete(pAVar3,0x48);
              local_b8[0]._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)this;
            }
          }
        }
        if (((ulong)local_b8[0]._M_pi & 7) == 0 && (Alloc *)local_b8[0]._M_pi != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_b8[0]._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (((Alloc *)local_b8[0]._M_pi)->size * 8 + 1);
          }
          else {
            ((Alloc *)local_b8[0]._M_pi)->use_count = ((Alloc *)local_b8[0]._M_pi)->use_count + 1;
          }
        }
        local_b8[1]._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
        Mesh::sync_array<signed_char>
                  ((Mesh *)&local_c8,(Int)pMVar5,(Read<signed_char> *)(ulong)(uint)low_dim,
                   (Int)local_b8);
        pAVar3 = *(Alloc **)this;
        if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
          piVar1 = &pAVar3->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar3);
            operator_delete(pAVar3,0x48);
          }
        }
        _Var4._M_pi = local_b8[0]._M_pi;
        *(Alloc **)this = local_c8;
        *(element_type **)(this + 8) = peStack_c0;
        if ((((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) &&
           (entering_parallel == '\x01')) {
          local_c8->use_count = local_c8->use_count + -1;
          *(size_t *)this = local_c8->size * 8 + 1;
        }
        local_c8 = (Alloc *)0x0;
        peStack_c0 = (element_type *)0x0;
        if (((ulong)local_b8[0]._M_pi & 7) == 0 && (Alloc *)local_b8[0]._M_pi != (Alloc *)0x0) {
          p_Var2 = local_b8[0]._M_pi + 3;
          *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc((Alloc *)local_b8[0]._M_pi);
            operator_delete(_Var4._M_pi,0x48);
          }
        }
        Adj::~Adj(&local_60);
        pvVar7 = extraout_RDX;
      }
      RVar10.write_.shared_alloc_.direct_ptr = pvVar7;
      RVar10.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Read<signed_char>)RVar10.write_.shared_alloc_;
    }
    pcVar8 = "high_dim <= 3";
    uVar6 = 0x26;
  }
  fail("assertion %s failed at %s +%d\n",pcVar8,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,uVar6);
}

Assistant:

Read<I8> mark_down(
    Mesh* mesh, Int high_dim, Int low_dim, Read<I8> high_marked) {
  OMEGA_H_CHECK(0 <= low_dim);
  OMEGA_H_CHECK(low_dim <= high_dim);
  OMEGA_H_CHECK(high_dim <= 3);
  if (high_dim == low_dim) return high_marked;
  auto l2h = mesh->ask_up(low_dim, high_dim);
  auto low_marks = mark_down(l2h, high_marked);
  if (!mesh->owners_have_all_upward(low_dim)) {
    low_marks = mesh->reduce_array(low_dim, low_marks, 1, OMEGA_H_MAX);
  }
  low_marks = mesh->sync_array(low_dim, low_marks, 1);
  return low_marks;
}